

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateConstructorCode
          (SingularString *this,Printer *p)

{
  bool bVar1;
  LogMessageFatal local_20 [16];
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    if ((*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) != 0) &&
       ((this->super_FieldGeneratorBase).is_oneof_ == false)) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/field_generators/string_field.cc"
                 ,0x263,0xd,"!is_inlined()");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
    }
  }
  else if ((this->super_FieldGeneratorBase).is_oneof_ == false) {
    io::Printer::Emit(p,0x1f,"\n    $field_$.InitDefault();\n  ");
    bVar1 = IsString((this->super_FieldGeneratorBase).field_);
    if ((bVar1) && (*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) == 0))
    {
      io::Printer::Emit(p,0x6b,
                        "\n      if ($pbi$::DebugHardenForceCopyDefaultString()) {\n        $field_$.Set(\"\", GetArena());\n      }\n    "
                       );
      return;
    }
  }
  return;
}

Assistant:

void SingularString::GenerateConstructorCode(io::Printer* p) const {
  if ((is_inlined() && EmptyDefault()) || is_oneof()) return;
  ABSL_DCHECK(!is_inlined());

  p->Emit(R"cc(
    $field_$.InitDefault();
  )cc");

  if (IsString(field_) && EmptyDefault()) {
    p->Emit(R"cc(
      if ($pbi$::DebugHardenForceCopyDefaultString()) {
        $field_$.Set("", GetArena());
      }
    )cc");
  }
}